

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O0

VectorBase<double> * __thiscall
soplex::VectorBase<double>::operator-(VectorBase<double> *this,VectorBase<double> *vec)

{
  int iVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  VectorBase<double> *in_RDI;
  int i;
  int dimen;
  VectorBase<double> *res;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  VectorBase((VectorBase<double> *)0x2d8874);
  dim((VectorBase<double> *)0x2d887e);
  std::vector<double,_std::allocator<double>_>::reserve
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar1 = dim((VectorBase<double> *)0x2d8897);
  for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar3);
    this_00 = (vector<double,_std::allocator<double>_> *)*pvVar2;
    operator[]((VectorBase<double> *)this_00,in_stack_ffffffffffffff9c);
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,(value_type_conflict2 *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  return in_RDI;
}

Assistant:

const VectorBase<R> operator-(const VectorBase<R>& vec) const
   {
      assert(vec.dim() == dim());
      VectorBase<R> res;
      res.val.reserve(dim());

      auto dimen = dim();

      for(decltype(dimen) i = 0; i < dimen; i++)
      {
         res.val.push_back(val[i] - vec[i]);
      }

      return res;
   }